

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_diamondskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  AFFECT_DATA af;
  
  if ((double)(int)ch->max_hit * 0.75 <= (double)ch->hit) {
    bVar1 = is_affected(ch,sn);
    if (!bVar1) {
      init_affect(&af);
      af.where = 0;
      af.aftype = 0;
      af.level = (short)level + 8;
      af.duration = (short)(level / -5) + 0x12;
      af.location = 0;
      af.owner = (CHAR_DATA *)0x0;
      af.end_fun = (AFF_FUN *)0x0;
      af.type = (short)sn;
      iVar2 = dice(5,0x14);
      af.modifier = (short)iVar2 * 0x14 + 2000;
      af.mod_name = 8;
      new_affect_to_char(ch,&af);
      act("$n concentrates, and $s skin hardens into a diamond-like carapace.",ch,(void *)0x0,
          (void *)0x0,0);
      act("The outer layers of your skin become almost impossibly hard.",ch,(void *)0x0,(void *)0x0,
          3);
      bVar1 = is_affected(ch,(int)gsn_stoneskin);
      if (bVar1) {
        switchD_00333f01::default(ch,(int)gsn_stoneskin);
      }
      bVar1 = is_affected(ch,(int)gsn_ironskin);
      if (bVar1) {
        switchD_00333f01::default(ch,(int)gsn_ironskin);
      }
      return;
    }
    txt = "Your skin is already as hard as it can become.\n\r";
  }
  else {
    txt = "You are bleeding too much to harden your skin.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_diamondskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	if (!(ch->hit < ch->max_hit * .75))
	{
		if (!is_affected(ch, sn))
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.aftype = AFT_SPELL;
			af.level = level + 8;
			af.duration = 18 - level / 5;
			af.location = 0;
			af.owner = nullptr;
			af.end_fun = nullptr;
			af.modifier = (dice(5, 20) + 100) * 20;
			af.mod_name = MOD_PROTECTION;
			new_affect_to_char(ch, &af);

			act("$n concentrates, and $s skin hardens into a diamond-like carapace.", ch, 0, 0, TO_ROOM);
			act("The outer layers of your skin become almost impossibly hard.", ch, 0, 0, TO_CHAR);
			if (is_affected(ch, gsn_stoneskin))
				affect_strip(ch, gsn_stoneskin);
			if (is_affected(ch, gsn_ironskin))
				affect_strip(ch, gsn_ironskin);
		}
		else
		{
			send_to_char("Your skin is already as hard as it can become.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("You are bleeding too much to harden your skin.\n\r", ch);
		return;
	}
}